

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

String * __thiscall luna::State::GetString(State *this,char *str,size_t len)

{
  String *len_00;
  char *in_RDX;
  StringPool *in_RSI;
  String *in_RDI;
  GC *unaff_retaddr;
  String *s;
  size_t in_stack_ffffffffffffffe0;
  
  std::unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_>::operator->
            ((unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *)0x1ef595);
  len_00 = StringPool::GetString(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  if (len_00 == (String *)0x0) {
    std::unique_ptr<luna::GC,_std::default_delete<luna::GC>_>::operator->
              ((unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *)0x1ef5c1);
    len_00 = GC::NewString(unaff_retaddr,(GCGeneration)((ulong)in_RDI >> 0x20));
    String::SetValue(&in_RSI->temp_,in_RDX,(size_t)len_00);
    std::unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_>::operator->
              ((unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *)0x1ef5f1);
    StringPool::AddString((StringPool *)unaff_retaddr,in_RDI);
  }
  return len_00;
}

Assistant:

String * State::GetString(const char *str, std::size_t len)
    {
        auto s = string_pool_->GetString(str, len);
        if (!s)
        {
            s = gc_->NewString();
            s->SetValue(str, len);
            string_pool_->AddString(s);
        }
        return s;
    }